

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str-util.hh
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* tinyusdz::split(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *__return_storage_ptr__,string *str,string *sep,uint32_t kMaxItems)

{
  value_type local_68;
  undefined1 local_41;
  ulong local_40;
  size_t count;
  size_t e;
  size_t s;
  string *psStack_20;
  uint32_t kMaxItems_local;
  string *sep_local;
  string *str_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *result;
  
  count = 0;
  local_40 = 0;
  local_41 = 0;
  s._4_4_ = kMaxItems;
  psStack_20 = sep;
  sep_local = str;
  str_local = (string *)__return_storage_ptr__;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  do {
    e = std::__cxx11::string::find_first_not_of((string *)sep_local,(ulong)psStack_20);
    if (e == 0xffffffffffffffff) {
      return __return_storage_ptr__;
    }
    count = std::__cxx11::string::find((string *)sep_local,(ulong)psStack_20);
    std::__cxx11::string::substr((ulong)&local_68,(ulong)sep_local);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(__return_storage_ptr__,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    local_40 = local_40 + 1;
  } while (local_40 <= s._4_4_);
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<std::string> split(
    const std::string &str, const std::string &sep,
    const uint32_t kMaxItems = (std::numeric_limits<int32_t>::max)() / 100) {
  size_t s;
  size_t e = 0;

  size_t count = 0;
  std::vector<std::string> result;

  while ((s = str.find_first_not_of(sep, e)) != std::string::npos) {
    e = str.find(sep, s);
    result.push_back(str.substr(s, e - s));
    if (++count > kMaxItems) {
      break;
    }
  }

  return result;
}